

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  ushort uVar1;
  SSL *ssl_00;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uchar *puVar7;
  undefined1 local_60 [7];
  bool ok;
  CBS server_verify;
  CBS client_verify;
  CBS renegotiated_connection;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if ((contents != (CBS *)0x0) && (uVar3 = ssl_protocol_version(ssl_00), 0x303 < uVar3)) {
    *out_alert = '/';
    return false;
  }
  if (((*(ushort *)&ssl_00->s3->field_0xdc >> 4 & 1) == 0) ||
     ((contents != (CBS *)0x0) == (bool)((byte)(*(ushort *)&ssl_00->s3->field_0xdc >> 6) & 1))) {
    if (contents == (CBS *)0x0) {
      hs_local._7_1_ = true;
    }
    else {
      sVar5 = InplaceVector<unsigned_char,_12UL>::size(&ssl_00->s3->previous_client_finished);
      sVar6 = InplaceVector<unsigned_char,_12UL>::size(&ssl_00->s3->previous_server_finished);
      if (sVar5 != sVar6) {
        __assert_fail("ssl->s3->previous_client_finished.size() == ssl->s3->previous_server_finished.size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x2df,
                      "bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      uVar1 = *(ushort *)&ssl_00->s3->field_0xdc;
      bVar2 = InplaceVector<unsigned_char,_12UL>::empty(&ssl_00->s3->previous_client_finished);
      if (((byte)(uVar1 >> 4) & 1) != ((bVar2 ^ 0xffU) & 1)) {
        __assert_fail("ssl->s3->initial_handshake_complete == !ssl->s3->previous_client_finished.empty()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x2e1,
                      "bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      iVar4 = CBS_get_u8_length_prefixed(contents,(CBS *)&client_verify.len);
      if ((iVar4 != 0) && (sVar5 = CBS_len(contents), sVar5 == 0)) {
        sVar5 = InplaceVector<unsigned_char,_12UL>::size(&ssl_00->s3->previous_client_finished);
        iVar4 = CBS_get_bytes((CBS *)&client_verify.len,(CBS *)&server_verify.len,sVar5);
        if (iVar4 != 0) {
          sVar5 = InplaceVector<unsigned_char,_12UL>::size(&ssl_00->s3->previous_server_finished);
          iVar4 = CBS_get_bytes((CBS *)&client_verify.len,(CBS *)local_60,sVar5);
          if ((iVar4 != 0) && (sVar5 = CBS_len((CBS *)&client_verify.len), sVar5 == 0)) {
            puVar7 = InplaceVector<unsigned_char,_12UL>::data(&ssl_00->s3->previous_client_finished)
            ;
            sVar5 = InplaceVector<unsigned_char,_12UL>::size(&ssl_00->s3->previous_client_finished);
            iVar4 = CBS_mem_equal((CBS *)&server_verify.len,puVar7,sVar5);
            bVar2 = false;
            if (iVar4 != 0) {
              puVar7 = InplaceVector<unsigned_char,_12UL>::data
                                 (&ssl_00->s3->previous_server_finished);
              sVar5 = InplaceVector<unsigned_char,_12UL>::size
                                (&ssl_00->s3->previous_server_finished);
              iVar4 = CBS_mem_equal((CBS *)local_60,puVar7,sVar5);
              bVar2 = iVar4 != 0;
            }
            iVar4 = CRYPTO_fuzzer_mode_enabled();
            if (iVar4 != 0) {
              bVar2 = true;
            }
            if (!bVar2) {
              ERR_put_error(0x10,0,0xca,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                            ,0x301);
              *out_alert = '(';
              return false;
            }
            *(ushort *)&ssl_00->s3->field_0xdc = *(ushort *)&ssl_00->s3->field_0xdc & 0xffbf | 0x40;
            return true;
          }
        }
        ERR_put_error(0x10,0,0xca,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x2f3);
        *out_alert = '(';
        return false;
      }
      ERR_put_error(0x10,0,0xc9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x2e7);
      *out_alert = '/';
      hs_local._7_1_ = false;
    }
  }
  else {
    *out_alert = '(';
    ERR_put_error(0x10,0,0xca,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x2ce);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ri_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                     CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents != NULL && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Servers may not switch between omitting the extension and supporting it.
  // See RFC 5746, sections 3.5 and 4.2.
  if (ssl->s3->initial_handshake_complete &&
      (contents != NULL) != ssl->s3->send_connection_binding) {
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    return false;
  }

  if (contents == NULL) {
    // Strictly speaking, if we want to avoid an attack we should *always* see
    // RI even on initial ServerHello because the client doesn't see any
    // renegotiation during an attack. However this would mean we could not
    // connect to any server which doesn't support RI.
    //
    // OpenSSL has |SSL_OP_LEGACY_SERVER_CONNECT| to control this, but in
    // practical terms every client sets it so it's just assumed here.
    return true;
  }

  // Check for logic errors.
  assert(ssl->s3->previous_client_finished.size() ==
         ssl->s3->previous_server_finished.size());
  assert(ssl->s3->initial_handshake_complete ==
         !ssl->s3->previous_client_finished.empty());

  // Parse out the extension contents.
  CBS renegotiated_connection;
  if (!CBS_get_u8_length_prefixed(contents, &renegotiated_connection) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_ENCODING_ERR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Check that the extension matches.
  CBS client_verify, server_verify;
  if (!CBS_get_bytes(&renegotiated_connection, &client_verify,
                     ssl->s3->previous_client_finished.size()) ||
      !CBS_get_bytes(&renegotiated_connection, &server_verify,
                     ssl->s3->previous_server_finished.size()) ||
      CBS_len(&renegotiated_connection) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  bool ok =
      CBS_mem_equal(&client_verify, ssl->s3->previous_client_finished.data(),
                    ssl->s3->previous_client_finished.size()) &&
      CBS_mem_equal(&server_verify, ssl->s3->previous_server_finished.data(),
                    ssl->s3->previous_server_finished.size());
  if (CRYPTO_fuzzer_mode_enabled()) {
    ok = true;
  }
  if (!ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  ssl->s3->send_connection_binding = true;
  return true;
}